

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void test_block22_verification_invoker(void)

{
  undefined8 uVar1;
  basic_wrap_stringstream<char> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char local_8d1;
  basic_wrap_stringstream<char> local_8d0;
  basic_cstring<const_char> local_738;
  basic_cstring<const_char> local_728;
  char local_711;
  basic_wrap_stringstream<char> local_710;
  basic_cstring<const_char> local_578;
  basic_cstring<const_char> local_568;
  char local_551;
  basic_wrap_stringstream<char> local_550;
  basic_cstring<const_char> local_3b8;
  basic_cstring<const_char> local_3a8;
  char local_391;
  basic_wrap_stringstream<char> local_390;
  basic_cstring<const_char> local_1f8;
  basic_cstring<const_char> local_1e8;
  test_block22_verification local_1d5 [8];
  test_block22_verification t;
  char local_1c1;
  basic_wrap_stringstream<char> local_1c0;
  basic_cstring<const_char> local_28;
  basic_cstring<const_char> local_18;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp",
             0x53);
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c0);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_1c0);
  local_1c1 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_1c1);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [26])"test_block22_verification");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [15])"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_28,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_18,0x25b,&local_28);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c0);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_1e8,
             "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp",
             0x53);
  memset(&local_390,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_390);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_390);
  local_391 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_391);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [26])"test_block22_verification");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [16])"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1f8,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1e8,0x25b,&local_1f8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_390);
  boost::unit_test::setup_conditional<test_block22_verification>(local_1d5);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_3a8,
             "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp",
             0x53);
  memset(&local_550,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_550);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_550);
  local_551 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_551);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [26])"test_block22_verification");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [13])"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3b8,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3a8,0x25b,&local_3b8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_550);
  test_block22_verification::test_method(local_1d5);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_568,
             "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp",
             0x53);
  memset(&local_710,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_710);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_710);
  local_711 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_711);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [26])"test_block22_verification");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [19])"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_578,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_568,0x25b,&local_578);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_710);
  boost::unit_test::teardown_conditional<test_block22_verification>(local_1d5);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_728,
             "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp",
             0x53);
  memset(&local_8d0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_8d0);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_8d0);
  local_8d1 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_8d1);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [26])"test_block22_verification");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [15])"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_738,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_728,0x25b,&local_738);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_8d0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_block22_verification) {
	// from POC-9 testnet, epoch 0
	ethash_light_t light = ethash_light_new(22);
	ethash_h256_t seedhash = stringToBlockhash("372eca2454ead349c3df0ab5d00b0b706b23e49d469387db91811cee0358fc6d");
	BOOST_ASSERT(light);
	ethash_return_value_t ret = ethash_light_compute(
		light,
		seedhash,
		0x495732e0ed7a801cU
	);
	BOOST_REQUIRE_EQUAL(blockhashToHexString(&ret.result), "00000b184f1fdd88bfd94c86c39e65db0c36144d5e43f745f722196e730cb614");
	ethash_h256_t difficulty = ethash_h256_static_init(0x2, 0x5, 0x40);
	BOOST_REQUIRE(ethash_check_difficulty(&ret.result, &difficulty));
	ethash_light_delete(light);
}